

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

QString * __thiscall QSslCertificate::subjectDisplayName(QSslCertificate *this)

{
  long lVar1;
  bool bVar2;
  QSslCertificate *in_RSI;
  QList<QString> *in_RDI;
  long in_FS_OFFSET;
  QStringList names;
  QList<QString> *this_00;
  SubjectInfo in_stack_ffffffffffffff84;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QList<QString>::QList((QList<QString> *)0x26f230);
  subjectInfo(in_RSI,in_stack_ffffffffffffff84);
  QList<QString>::operator=(this_00,in_RDI);
  QList<QString>::~QList((QList<QString> *)0x26f25d);
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f267);
  if (bVar2) {
    subjectInfo(in_RSI,in_stack_ffffffffffffff84);
    QList<QString>::operator=(this_00,in_RDI);
    QList<QString>::~QList((QList<QString> *)0x26f2b8);
    bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f2c2);
    if (bVar2) {
      subjectInfo(in_RSI,in_stack_ffffffffffffff84);
      QList<QString>::operator=(this_00,in_RDI);
      QList<QString>::~QList((QList<QString> *)0x26f313);
      bVar2 = QList<QString>::isEmpty((QList<QString> *)0x26f31d);
      if (bVar2) {
        QString::QString((QString *)0x26f34a);
      }
      else {
        QList<QString>::constFirst(this_00);
        QString::QString((QString *)this_00,(QString *)in_RDI);
      }
    }
    else {
      QList<QString>::constFirst(this_00);
      QString::QString((QString *)this_00,(QString *)in_RDI);
    }
  }
  else {
    QList<QString>::constFirst(this_00);
    QString::QString((QString *)this_00,(QString *)in_RDI);
  }
  QList<QString>::~QList((QList<QString> *)0x26f35c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QString *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QString QSslCertificate::subjectDisplayName() const
{
    QStringList names;
    names = subjectInfo(QSslCertificate::CommonName);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::Organization);
    if (!names.isEmpty())
        return names.constFirst();
    names = subjectInfo(QSslCertificate::OrganizationalUnitName);
    if (!names.isEmpty())
        return names.constFirst();

    return QString();
}